

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

bool __thiscall
PartiallySignedTransaction::Merge(PartiallySignedTransaction *this,PartiallySignedTransaction *psbt)

{
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  *this_00;
  _Base_ptr __x;
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
  *this_01;
  _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
  *this_02;
  _Base_ptr p_Var6;
  ulong uVar7;
  long in_FS_OFFSET;
  Txid local_78;
  Txid local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::GetHash(&local_58,(CMutableTransaction *)this);
  CMutableTransaction::GetHash(&local_78,(CMutableTransaction *)psbt);
  bVar3 = transaction_identifier<false>::operator!=(&local_58,&local_78);
  if (!bVar3) {
    uVar4 = 0;
    while( true ) {
      uVar7 = (ulong)uVar4;
      pPVar1 = (this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 800) <= uVar7)
      break;
      PSBTInput::Merge(pPVar1 + uVar7,
                       (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar7);
      uVar4 = uVar4 + 1;
    }
    uVar4 = 0;
    while( true ) {
      uVar7 = (ulong)uVar4;
      pPVar2 = (this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x138) <=
          uVar7) break;
      PSBTOutput::Merge(pPVar2 + uVar7,
                        (psbt->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar7);
      uVar4 = uVar4 + 1;
    }
    this_00 = &this->m_xpubs;
    for (p_Var6 = (psbt->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(psbt->m_xpubs)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
      __x = p_Var6 + 1;
      sVar5 = std::
              map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
              ::count(this_00,(key_type *)__x);
      if (sVar5 == 0) {
        this_02 = &std::
                   map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                   ::operator[](this_00,(key_type *)__x)->_M_t;
        std::
        _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
        ::operator=(this_02,(_Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
                             *)(p_Var6 + 2));
      }
      else {
        this_01 = (_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                   *)std::
                     map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                     ::operator[](this_00,(key_type *)__x);
        std::
        _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
        ::_M_insert_range_unique<std::_Rb_tree_const_iterator<CExtPubKey>>
                  (this_01,p_Var6[2]._M_right,
                   (_Rb_tree_const_iterator<CExtPubKey>)&p_Var6[2]._M_parent);
      }
    }
    std::
    _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
    ::
    _M_insert_range_unique<std::_Rb_tree_const_iterator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                *)&this->unknown,
               (psbt->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                )&(psbt->unknown)._M_t._M_impl.super__Rb_tree_header);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return !bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool PartiallySignedTransaction::Merge(const PartiallySignedTransaction& psbt)
{
    // Prohibited to merge two PSBTs over different transactions
    if (tx->GetHash() != psbt.tx->GetHash()) {
        return false;
    }

    for (unsigned int i = 0; i < inputs.size(); ++i) {
        inputs[i].Merge(psbt.inputs[i]);
    }
    for (unsigned int i = 0; i < outputs.size(); ++i) {
        outputs[i].Merge(psbt.outputs[i]);
    }
    for (auto& xpub_pair : psbt.m_xpubs) {
        if (m_xpubs.count(xpub_pair.first) == 0) {
            m_xpubs[xpub_pair.first] = xpub_pair.second;
        } else {
            m_xpubs[xpub_pair.first].insert(xpub_pair.second.begin(), xpub_pair.second.end());
        }
    }
    unknown.insert(psbt.unknown.begin(), psbt.unknown.end());

    return true;
}